

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBac.c
# Opt level: O2

Bac_Man_t * Bac_ManReadBacInt(Vec_Str_t *vOut)

{
  size_t __nmemb;
  int nCapMin;
  int iVar1;
  int iVar2;
  int iVar3;
  Bac_Man_t *p;
  char *pcVar4;
  Abc_Nam_t *pAVar5;
  Bac_Ntk_t *pBVar6;
  ulong uVar7;
  ulong uVar8;
  uint nCapMin_00;
  long lVar9;
  long lVar10;
  int Pos;
  int Num4;
  int Num3;
  int Num2;
  int Num1;
  int nNtks;
  int local_434;
  Vec_Str_t *local_430;
  ulong local_428;
  long local_420;
  char Buffer [1000];
  
  memset(Buffer,0,1000);
  Buffer[0] = '#';
  Pos = 0;
  while (Buffer[0] == '#') {
    iVar1 = BacManReadBacLine(vOut,&Pos,Buffer,&stack0xffffffffffffffd0);
    if (iVar1 == 0) {
      return (Bac_Man_t *)0x0;
    }
  }
  iVar1 = BacManReadBacNameAndNums(Buffer,&nNtks,&Num2,&Num3,&Num4);
  if (iVar1 != 0) {
    if (nNtks < 1) {
      __assert_fail("nNtks > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacBac.c"
                    ,0x9a,"Bac_Man_t *Bac_ManReadBacInt(Vec_Str_t *)");
    }
    lVar9 = 1;
    p = (Bac_Man_t *)calloc(1,0x530);
    pcVar4 = Extra_FileDesignName(Buffer);
    p->pName = pcVar4;
    pcVar4 = Abc_UtilStrsav(Buffer);
    p->pSpec = pcVar4;
    pAVar5 = Abc_NamStart(1000,0x18);
    p->pStrs = pAVar5;
    pAVar5 = Abc_NamStart(1000,0x18);
    p->pMods = pAVar5;
    p->iRoot = 1;
    p->nNtks = nNtks;
    __nmemb = (ulong)(uint)nNtks + 1;
    local_428 = (ulong)(uint)nNtks;
    pBVar6 = (Bac_Ntk_t *)calloc(__nmemb,0xd0);
    p->pNtks = pBVar6;
    for (lVar10 = 0xd0; __nmemb * 0xd0 - lVar10 != 0; lVar10 = lVar10 + 0xd0) {
      *(Bac_Man_t **)((long)&pBVar6->pDesign + lVar10) = p;
    }
    Bac_ManSetupTypes(p->pPrimNames,p->pPrimSymbs);
    local_430 = vOut;
    while( true ) {
      uVar7 = (ulong)p->nNtks;
      if ((long)uVar7 < lVar9) {
        lVar10 = 0xd0;
        for (lVar9 = 1; lVar9 <= (int)uVar7; lVar9 = lVar9 + 1) {
          Bac_ManReadBacNtk(vOut,&Pos,(Bac_Ntk_t *)((long)&p->pNtks->pDesign + lVar10));
          uVar7 = (ulong)(uint)p->nNtks;
          lVar10 = lVar10 + 0xd0;
        }
        if ((int)uVar7 == (int)local_428) {
          if (Pos == vOut->nSize) {
            return p;
          }
          __assert_fail("Pos == Vec_StrSize(vOut)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacBac.c"
                        ,0xb2,"Bac_Man_t *Bac_ManReadBacInt(Vec_Str_t *)");
        }
        __assert_fail("Bac_ManNtkNum(p) == nNtks",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacBac.c"
                      ,0xb1,"Bac_Man_t *Bac_ManReadBacInt(Vec_Str_t *)");
      }
      pBVar6 = p->pNtks + lVar9;
      local_420 = lVar9;
      iVar1 = BacManReadBacLine(vOut,&Pos,Buffer,&stack0xffffffffffffffd0);
      if ((iVar1 == 0) ||
         (iVar2 = BacManReadBacNameAndNums(Buffer,&Num1,&Num2,&Num3,&Num4), nCapMin = Num1,
         iVar3 = Num2, iVar1 = Num3, iVar2 == 0)) break;
      if (((Num1 < 0) || (Num2 < 0)) || (Num3 < 0)) {
        __assert_fail("Num1 >= 0 && Num2 >= 0 && Num3 >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacBac.c"
                      ,0xa9,"Bac_Man_t *Bac_ManReadBacInt(Vec_Str_t *)");
      }
      iVar2 = Abc_NamStrFindOrAdd(p->pStrs,Buffer,(int *)0x0);
      if (pBVar6->pDesign == (Bac_Man_t *)0x0) {
        __assert_fail("pNew->pDesign != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                      ,0x218,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
      }
      if ((pBVar6->vInputs).nSize != 0) {
        __assert_fail("Bac_NtkPiNum(pNew) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                      ,0x219,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
      }
      if ((pBVar6->vOutputs).nSize != 0) {
        __assert_fail("Bac_NtkPoNum(pNew) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                      ,0x21a,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
      }
      pBVar6->NameId = iVar2;
      pBVar6->iCopy = -1;
      pBVar6->iBoxNtk = -1;
      pBVar6->iBoxObj = -1;
      Vec_IntGrow(&pBVar6->vInputs,nCapMin);
      Vec_IntGrow(&pBVar6->vOutputs,iVar3);
      Vec_StrGrow(&pBVar6->vType,iVar1);
      Vec_IntGrow(&pBVar6->vFanin,iVar1);
      pAVar5 = pBVar6->pDesign->pMods;
      pcVar4 = Bac_NtkStr(pBVar6,iVar2);
      iVar1 = Abc_NamStrFindOrAdd(pAVar5,pcVar4,&local_434);
      if (local_434 == 0) {
        iVar3 = (int)(((long)pBVar6 - (long)pBVar6->pDesign->pNtks) / 0xd0);
        if ((iVar3 < 1) || (pBVar6->pDesign->nNtks < iVar3)) {
          __assert_fail("Bac_ManNtkIsOk(p->pDesign, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                        ,0xd2,"int Bac_NtkId(Bac_Ntk_t *)");
        }
        if (iVar1 != iVar3) {
          __assert_fail("NtkId == Bac_NtkId(pNew)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                        ,0x228,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
        }
      }
      else {
        pcVar4 = Bac_NtkStr(pBVar6,iVar2);
        printf("Network with name %s already exists.\n",pcVar4);
      }
      vOut = local_430;
      nCapMin_00 = Num4 * 3;
      Vec_IntGrow(&pBVar6->vInfo,nCapMin_00);
      uVar7 = 0;
      if (0 < (int)nCapMin_00) {
        uVar7 = (ulong)nCapMin_00;
      }
      for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
        (pBVar6->vInfo).pArray[uVar8] = -1;
      }
      (pBVar6->vInfo).nSize = nCapMin_00;
      lVar9 = local_420 + 1;
    }
    Bac_ManFree(p);
  }
  return (Bac_Man_t *)0x0;
}

Assistant:

Bac_Man_t * Bac_ManReadBacInt( Vec_Str_t * vOut )
{
    Bac_Man_t * p;
    Bac_Ntk_t * pNtk;
    char Buffer[1000] = "#"; 
    int i, NameId, Pos = 0, nNtks, Num1, Num2, Num3, Num4;
    while ( Buffer[0] == '#' )
        if ( !BacManReadBacLine(vOut, &Pos, Buffer, Buffer+1000) )
            return NULL;
    if ( !BacManReadBacNameAndNums(Buffer, &nNtks, &Num2, &Num3, &Num4) )
        return NULL;
    // start manager
    assert( nNtks > 0 );
    p = Bac_ManAlloc( Buffer, nNtks );
    // start networks
    Bac_ManForEachNtk( p, pNtk, i )
    {
        if ( !BacManReadBacLine(vOut, &Pos, Buffer, Buffer+1000) )
        {
            Bac_ManFree( p );
            return NULL;
        }
        if ( !BacManReadBacNameAndNums(Buffer, &Num1, &Num2, &Num3, &Num4) )
        {
            Bac_ManFree( p );
            return NULL;
        }
        assert( Num1 >= 0 && Num2 >= 0 && Num3 >= 0 );
        NameId = Abc_NamStrFindOrAdd( p->pStrs, Buffer, NULL );
        Bac_NtkAlloc( pNtk, NameId, Num1, Num2, Num3 );
        Vec_IntFill( &pNtk->vInfo, 3 * Num4, -1 );
    }
    // read networks
    Bac_ManForEachNtk( p, pNtk, i )
        Bac_ManReadBacNtk( vOut, &Pos, pNtk );
    assert( Bac_ManNtkNum(p) == nNtks );
    assert( Pos == Vec_StrSize(vOut) );
    return p;
}